

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * __thiscall tcu::Format::Bitfield<16UL>::toStream(Bitfield<16UL> *this,ostream *stream)

{
  BitDesc *pBVar1;
  Hex<4UL> hex;
  
  hex.value = this->m_value;
  for (pBVar1 = this->m_begin; pBVar1 != this->m_end; pBVar1 = pBVar1 + 1) {
    if ((pBVar1->bit & hex.value) != 0) {
      if (hex.value != this->m_value) {
        std::operator<<(stream,"|");
      }
      std::operator<<(stream,pBVar1->name);
      hex.value = hex.value ^ pBVar1->bit;
    }
  }
  if (hex.value != 0) {
    if (hex.value != this->m_value) {
      std::operator<<(stream,"|");
    }
    Format::operator<<(stream,hex);
  }
  return stream;
}

Assistant:

std::ostream& toStream (std::ostream& stream)
	{
		deUint64 bitsLeft = m_value;
		for (const BitDesc* curDesc = m_begin; curDesc != m_end; curDesc++)
		{
			if (curDesc->bit & bitsLeft)
			{
				if (bitsLeft != m_value)
					stream << "|";
				stream << curDesc->name;
				bitsLeft ^= curDesc->bit;
			}
		}

		if (bitsLeft != 0)
		{
			if (bitsLeft != m_value)
				stream << "|";
			stream << Hex<BitfieldSize/4>(bitsLeft);
		}

		return stream;
	}